

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

vec2 vec2_isometric_projection(vec2 v,float scale,float angle)

{
  vec2 vVar1;
  
  vVar1 = vec2_rotate(v,angle);
  vVar1.y = vVar1.y * scale;
  return vVar1;
}

Assistant:

vec2 vec2_isometric_projection(vec2 v, float scale, float angle) {
    vec2 vp;

    vp = vec2_rotate(v, angle);
    vp.y *= scale;

    return vp;
}